

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void utime_cb(uv_fs_t *req)

{
  undefined8 *puVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  undefined8 uVar7;
  uv__io_cb p_Var8;
  uv_loop_t *puVar9;
  uv_loop_t *extraout_RAX;
  uv_loop_t *puVar10;
  undefined8 uVar11;
  undefined1 *__s1;
  __off64_t _Var12;
  void *pvVar13;
  void *pvVar14;
  undefined8 extraout_RAX_00;
  char *pcVar15;
  uv_fs_t *puVar16;
  char *pcVar17;
  undefined1 *puVar18;
  long unaff_R12;
  _func_void *unaff_R14;
  _func_void *p_Var19;
  uv_fs_t *__s;
  long lVar20;
  void *pvVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uv_buf_t uVar24;
  undefined1 auStack_11ea [2];
  code *pcStack_11e8;
  undefined8 uStack_11e0;
  void *pvStack_11d8;
  long lStack_11d0;
  undefined1 auStack_1160 [16];
  undefined1 auStack_1150 [16];
  undefined8 uStack_1138;
  uv_fs_t *puStack_1130;
  uv_fs_t *puStack_1128;
  undefined8 uStack_1120;
  code *pcStack_1110;
  code *pcStack_1108;
  undefined8 uStack_1100;
  undefined1 auStack_10f0 [16];
  undefined1 auStack_10e0 [16];
  undefined1 auStack_10d0 [16];
  undefined1 auStack_10c0 [16];
  undefined1 auStack_10b0 [256];
  undefined1 auStack_fb0 [256];
  undefined1 auStack_eb0 [128];
  undefined1 auStack_e30 [136];
  undefined1 *puStack_da8;
  uv_fs_t *puStack_da0;
  code *pcStack_d98;
  undefined8 uStack_d90;
  code *pcStack_d80;
  undefined8 uStack_d78;
  code *pcStack_d68;
  uv_fs_t *puStack_d60;
  code *pcStack_d58;
  uv_fs_t uStack_d50;
  uv_fs_t *puStack_b98;
  uv_fs_t *puStack_b90;
  code *pcStack_b88;
  uv_fs_t *puStack_b80;
  undefined1 auStack_b70 [8];
  code *pcStack_b68;
  undefined1 auStack_b60 [16];
  undefined1 auStack_b50 [496];
  uv_loop_t uStack_960;
  uv_loop_t *puStack_5d8;
  uv_loop_t *puStack_5d0;
  char *pcStack_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined1 auStack_5a8 [576];
  _func_void *p_Stack_368;
  ulong uStack_208;
  _func_void *p_Stack_200;
  char acStack_1e0 [16];
  undefined1 auStack_1d0 [88];
  long lStack_178;
  
  if (req == &utime_req) {
    if (utime_req.result != 0) goto LAB_0015f96e;
    if (utime_req.fs_type == UV_FS_UTIME) {
      check_utime(*utime_req.data,*(double *)((long)utime_req.data + 8),
                  *(double *)((long)utime_req.data + 0x10),0);
      uv_fs_req_cleanup(&utime_req);
      utime_cb_count = utime_cb_count + 1;
      return;
    }
  }
  else {
    utime_cb_cold_1();
LAB_0015f96e:
    utime_cb_cold_2();
  }
  utime_cb_cold_3();
  builtin_strncpy(acStack_1e0,"test_file",10);
  loop = (uv_loop_t *)uv_default_loop();
  unlink(acStack_1e0);
  uVar3 = uv_fs_open(0,auStack_1d0,acStack_1e0,0x42,0x180,0);
  uVar6 = (ulong)uVar3;
  if ((int)uVar3 < 0) {
    run_test_fs_utime_round_cold_6();
LAB_0015fb26:
    run_test_fs_utime_round_cold_5();
LAB_0015fb33:
    run_test_fs_utime_round_cold_1();
LAB_0015fb40:
    run_test_fs_utime_round_cold_2();
LAB_0015fb4d:
    run_test_fs_utime_round_cold_3();
  }
  else {
    if (lStack_178 < 0) goto LAB_0015fb26;
    unaff_R14 = (_func_void *)auStack_1d0;
    uv_fs_req_cleanup(unaff_R14);
    iVar4 = uv_fs_close(loop,unaff_R14,uVar6,0);
    if (iVar4 != 0) goto LAB_0015fb33;
    iVar4 = uv_fs_utime(0,auStack_1d0,acStack_1e0,0);
    if (iVar4 != 0) goto LAB_0015fb40;
    if (lStack_178 != 0) goto LAB_0015fb4d;
    uv_fs_req_cleanup(auStack_1d0);
    check_utime(acStack_1e0,-14245440.25,-14245440.25,0);
    unlink(acStack_1e0);
    uVar6 = uv_default_loop();
    uv_walk(uVar6,close_walk_cb,0);
    uv_run(uVar6,0);
    uVar7 = uv_default_loop();
    iVar4 = uv_loop_close(uVar7);
    if (iVar4 == 0) {
      uv_library_shutdown();
      return;
    }
  }
  run_test_fs_utime_round_cold_4();
  auStack_5a8._456_8_ = (uv__io_cb)0x15fb70;
  uStack_208 = uVar6;
  p_Stack_200 = unaff_R14;
  loop = (uv_loop_t *)uv_default_loop();
  auStack_5a8._456_8_ = (uv__io_cb)0x15fb86;
  unlink("test_file");
  puVar9 = (uv_loop_t *)0x0;
  auStack_5a8._456_8_ = (uv__io_cb)0x15fba3;
  iVar4 = uv_fs_open(0,auStack_5a8 + 0x1e8,"test_file",0x42,0x180,0);
  if (iVar4 < 0) {
    auStack_5a8._456_8_ = (uv__io_cb)0x15fd20;
    run_test_fs_futime_cold_1();
LAB_0015fd20:
    auStack_5a8._456_8_ = (uv__io_cb)0x15fd25;
    run_test_fs_futime_cold_2();
LAB_0015fd25:
    p_Var19 = unaff_R14;
    auStack_5a8._456_8_ = (uv__io_cb)0x15fd2a;
    run_test_fs_futime_cold_3();
LAB_0015fd2a:
    auStack_5a8._456_8_ = (uv__io_cb)0x15fd2f;
    run_test_fs_futime_cold_4();
LAB_0015fd2f:
    auStack_5a8._456_8_ = (uv__io_cb)0x15fd34;
    run_test_fs_futime_cold_5();
LAB_0015fd34:
    auStack_5a8._456_8_ = (uv__io_cb)0x15fd39;
    run_test_fs_futime_cold_6();
LAB_0015fd39:
    auStack_5a8._456_8_ = (uv__io_cb)0x15fd3e;
    run_test_fs_futime_cold_7();
LAB_0015fd3e:
    p_Var8 = (uv__io_cb)0x193567;
    auStack_5a8._456_8_ = (uv__io_cb)0x15fd43;
    run_test_fs_futime_cold_8();
  }
  else {
    if ((long)p_Stack_368 < 0) goto LAB_0015fd20;
    unaff_R14 = (_func_void *)(auStack_5a8 + 0x1e8);
    auStack_5a8._456_8_ = (uv__io_cb)0x15fbc6;
    uv_fs_req_cleanup(unaff_R14);
    auStack_5a8._456_8_ = (uv__io_cb)0x15fbd9;
    uv_fs_close(loop,unaff_R14,iVar4,0);
    puVar9 = (uv_loop_t *)0x0;
    auStack_5a8._456_8_ = (uv__io_cb)0x15fbf8;
    iVar4 = uv_fs_open(0,unaff_R14,"test_file",2,0,0);
    p_Var19 = p_Stack_368;
    if (iVar4 < 0) goto LAB_0015fd25;
    if ((long)p_Stack_368 < 0) goto LAB_0015fd2a;
    auStack_5a8._456_8_ = (uv__io_cb)0x15fc1b;
    uv_fs_req_cleanup();
    puVar9 = (uv_loop_t *)0x0;
    auStack_5a8._456_8_ = (uv__io_cb)0x15fc35;
    iVar4 = uv_fs_futime(0,auStack_5a8 + 0x1e8,(ulong)p_Var19 & 0xffffffff,0);
    if (iVar4 != 0) goto LAB_0015fd2f;
    if (p_Stack_368 != (_func_void *)0x0) goto LAB_0015fd34;
    auStack_5a8._456_8_ = (uv__io_cb)0x15fc53;
    uv_fs_req_cleanup(auStack_5a8 + 0x1e8);
    auStack_5a8._456_8_ = (uv__io_cb)0x15fc68;
    check_utime("test_file",400497753.25,400497753.25,0);
    auStack_5a8._472_8_ = (void *)0x41d33e5199000000;
    auStack_5a8._480_8_ = (void *)0x41d33e5199000000;
    auStack_5a8._464_8_ = "test_file";
    auStack_5a8._456_8_ = (uv__io_cb)0x15fca8;
    puVar9 = loop;
    futime_req.data = auStack_5a8 + 0x1d0;
    iVar4 = uv_fs_futime(loop,&futime_req,(ulong)p_Var19 & 0xffffffff,futime_cb);
    if (iVar4 != 0) goto LAB_0015fd39;
    auStack_5a8._456_8_ = (uv__io_cb)0x15fcbe;
    puVar9 = loop;
    uv_run();
    if (futime_cb_count != 1) goto LAB_0015fd3e;
    auStack_5a8._456_8_ = (uv__io_cb)0x15fcd3;
    unlink("test_file");
    auStack_5a8._456_8_ = (uv__io_cb)0x15fcd8;
    p_Var8 = (uv__io_cb)uv_default_loop();
    auStack_5a8._456_8_ = (uv__io_cb)0x15fcec;
    uv_walk(p_Var8,close_walk_cb,0);
    auStack_5a8._456_8_ = (uv__io_cb)0x15fcf6;
    uv_run(p_Var8);
    auStack_5a8._456_8_ = (uv__io_cb)0x15fcfb;
    puVar9 = (uv_loop_t *)uv_default_loop();
    auStack_5a8._456_8_ = (uv__io_cb)0x15fd03;
    iVar4 = uv_loop_close();
    if (iVar4 == 0) {
      auStack_5a8._456_8_ = (uv__io_cb)0x15fd0c;
      uv_library_shutdown();
      return;
    }
  }
  auStack_5a8._456_8_ = futime_cb;
  run_test_fs_futime_cold_9();
  auStack_5a8._456_8_ = p_Var8;
  if (puVar9 == (uv_loop_t *)&futime_req) {
    if (futime_req.result != 0) goto LAB_0015fd9f;
    if (futime_req.fs_type == UV_FS_FUTIME) {
      auStack_5a8._448_8_ = (_func_void *)0x15fd8a;
      check_utime(*futime_req.data,*(double *)((long)futime_req.data + 8),
                  *(double *)((long)futime_req.data + 0x10),0);
      auStack_5a8._448_8_ = (_func_void *)0x15fd92;
      uv_fs_req_cleanup(&futime_req);
      futime_cb_count = futime_cb_count + 1;
      return;
    }
  }
  else {
    auStack_5a8._448_8_ = (_func_void *)0x15fd9f;
    futime_cb_cold_1();
LAB_0015fd9f:
    auStack_5a8._448_8_ = (_func_void *)0x15fda4;
    futime_cb_cold_2();
  }
  auStack_5a8._448_8_ = run_test_fs_lutime;
  futime_cb_cold_3();
  puStack_5d0 = (uv_loop_t *)0x15fdb8;
  auStack_5a8._440_8_ = p_Var8;
  auStack_5a8._448_8_ = p_Var19;
  loop = (uv_loop_t *)uv_default_loop();
  pcVar15 = "test_file";
  puStack_5d0 = (uv_loop_t *)0x15fdce;
  unlink("test_file");
  puVar9 = (uv_loop_t *)0x0;
  puStack_5d0 = (uv_loop_t *)0x15fdeb;
  iVar4 = uv_fs_open(0,auStack_5a8,"test_file",0x42,0x180,0);
  if (iVar4 < 0) {
    puStack_5d0 = (uv_loop_t *)0x15ff77;
    run_test_fs_lutime_cold_1();
LAB_0015ff77:
    puStack_5d0 = (uv_loop_t *)0x15ff7c;
    run_test_fs_lutime_cold_2();
LAB_0015ff7c:
    puStack_5d0 = (uv_loop_t *)0x15ff81;
    run_test_fs_lutime_cold_3();
LAB_0015ff81:
    puStack_5d0 = (uv_loop_t *)0x15ff86;
    run_test_fs_lutime_cold_4();
LAB_0015ff86:
    puStack_5d0 = (uv_loop_t *)0x15ff8b;
    run_test_fs_lutime_cold_5();
LAB_0015ff8b:
    puStack_5d0 = (uv_loop_t *)0x15ff90;
    run_test_fs_lutime_cold_6();
LAB_0015ff90:
    puStack_5d0 = (uv_loop_t *)0x15ff95;
    run_test_fs_lutime_cold_7();
LAB_0015ff95:
    puStack_5d0 = (uv_loop_t *)0x15ff9a;
    run_test_fs_lutime_cold_8();
  }
  else {
    if ((long)auStack_5a8._88_8_ < 0) goto LAB_0015ff77;
    p_Var19 = (_func_void *)auStack_5a8;
    puStack_5d0 = (uv_loop_t *)0x15fe0e;
    uv_fs_req_cleanup(p_Var19);
    puStack_5d0 = (uv_loop_t *)0x15fe21;
    uv_fs_close(loop,p_Var19,iVar4,0);
    pcVar15 = "test_file_symlink";
    puStack_5d0 = (uv_loop_t *)0x15fe30;
    unlink("test_file_symlink");
    puVar9 = (uv_loop_t *)0x0;
    puStack_5d0 = (uv_loop_t *)0x15fe4a;
    iVar4 = uv_fs_symlink(0,p_Var19,"test_file","test_file_symlink",0,0);
    if (iVar4 != 0) goto LAB_0015ff7c;
    if ((void *)auStack_5a8._88_8_ != (void *)0x0) goto LAB_0015ff81;
    p_Var19 = (_func_void *)auStack_5a8;
    puStack_5d0 = (uv_loop_t *)0x15fe6b;
    uv_fs_req_cleanup();
    auStack_5a8._0_8_ = &pcStack_5c0;
    uStack_5b8 = 0x41b7df1c59400000;
    uStack_5b0 = 0x41b7df1c59400000;
    pcStack_5c0 = "test_file_symlink";
    puVar9 = (uv_loop_t *)0x0;
    puStack_5d0 = (uv_loop_t *)0x15fe9b;
    iVar4 = uv_fs_lutime(0,p_Var19,"test_file_symlink",0);
    if (iVar4 != 0) goto LAB_0015ff86;
    puVar9 = (uv_loop_t *)auStack_5a8;
    puStack_5d0 = (uv_loop_t *)0x15fead;
    lutime_cb((uv_fs_t *)puVar9);
    if (lutime_cb_count != 1) goto LAB_0015ff8b;
    uStack_5b8 = 0x41d33e5199000000;
    uStack_5b0 = 0x41d33e5199000000;
    pcStack_5c0 = "test_file_symlink";
    puStack_5d0 = (uv_loop_t *)0x15fef1;
    puVar9 = loop;
    iVar4 = uv_fs_lutime(loop,auStack_5a8,"test_file_symlink",lutime_cb);
    if (iVar4 != 0) goto LAB_0015ff90;
    puStack_5d0 = (uv_loop_t *)0x15ff07;
    puVar9 = loop;
    uv_run(loop,0);
    if (lutime_cb_count != 2) goto LAB_0015ff95;
    puStack_5d0 = (uv_loop_t *)0x15ff20;
    unlink("test_file");
    puStack_5d0 = (uv_loop_t *)0x15ff2c;
    unlink("test_file_symlink");
    puStack_5d0 = (uv_loop_t *)0x15ff31;
    pcVar15 = (char *)uv_default_loop();
    puStack_5d0 = (uv_loop_t *)0x15ff45;
    uv_walk(pcVar15,close_walk_cb,0);
    puStack_5d0 = (uv_loop_t *)0x15ff4f;
    uv_run(pcVar15,0);
    puStack_5d0 = (uv_loop_t *)0x15ff54;
    puVar9 = (uv_loop_t *)uv_default_loop();
    puStack_5d0 = (uv_loop_t *)0x15ff5c;
    iVar4 = uv_loop_close();
    if (iVar4 == 0) {
      puStack_5d0 = (uv_loop_t *)0x15ff65;
      uv_library_shutdown();
      return;
    }
  }
  puStack_5d0 = (uv_loop_t *)lutime_cb;
  run_test_fs_lutime_cold_9();
  puStack_5d0 = (uv_loop_t *)pcVar15;
  if (puVar9->watcher_queue[0] == (void *)0x0) {
    if (puVar9->backend_fd == UV_FS_LUTIME) {
      puVar1 = (undefined8 *)puVar9->data;
      puStack_5d8 = (uv_loop_t *)0x15ffca;
      check_utime((char *)*puVar1,(double)puVar1[1],(double)puVar1[2],1);
      puStack_5d8 = (uv_loop_t *)0x15ffd2;
      uv_fs_req_cleanup(puVar9);
      lutime_cb_count = lutime_cb_count + 1;
      return;
    }
  }
  else {
    puStack_5d8 = (uv_loop_t *)0x15ffdf;
    lutime_cb_cold_1();
    puVar9 = (uv_loop_t *)pcVar15;
  }
  puStack_5d8 = (uv_loop_t *)run_test_fs_stat_missing_path;
  lutime_cb_cold_2();
  uStack_960.async_unused = (_func_void *)0x15fff1;
  puStack_5d8 = puVar9;
  loop = (uv_loop_t *)uv_default_loop();
  uStack_960.async_unused = (_func_void *)0x16000d;
  iVar4 = uv_fs_stat(0,uStack_960.async_io_watcher.pending_queue,"non_existent_file",0);
  if (iVar4 == -2) {
    if (uStack_960.signal_pipefd != (int  [2])0xfffffffffffffffe) goto LAB_0016006d;
    uStack_960.async_unused = (_func_void *)0x160024;
    uv_fs_req_cleanup(uStack_960.async_io_watcher.pending_queue);
    uStack_960.async_unused = (_func_void *)0x160029;
    puVar9 = (uv_loop_t *)uv_default_loop();
    uStack_960.async_unused = (_func_void *)0x16003d;
    uv_walk(puVar9,close_walk_cb,0);
    uStack_960.async_unused = (_func_void *)0x160047;
    uv_run(puVar9,0);
    uStack_960.async_unused = (_func_void *)0x16004c;
    uVar7 = uv_default_loop();
    uStack_960.async_unused = (_func_void *)0x160054;
    iVar4 = uv_loop_close(uVar7);
    if (iVar4 == 0) {
      uStack_960.async_unused = (_func_void *)0x16005d;
      uv_library_shutdown();
      return;
    }
  }
  else {
    uStack_960.async_unused = (_func_void *)0x16006d;
    run_test_fs_stat_missing_path_cold_1();
LAB_0016006d:
    uStack_960.async_unused = (_func_void *)0x160072;
    run_test_fs_stat_missing_path_cold_2();
  }
  uStack_960.async_unused = run_test_fs_scandir_empty_dir;
  run_test_fs_stat_missing_path_cold_3();
  auStack_b50._472_8_ = (void *)0x160086;
  uStack_960.async_handles[1] = puVar9;
  uStack_960.async_unused = p_Var19;
  loop = (uv_loop_t *)uv_default_loop();
  pcVar15 = "./empty_dir/";
  p_Var19 = (_func_void *)(auStack_b50 + 0x1f0);
  auStack_b50._472_8_ = (void *)0x1600ae;
  uv_fs_mkdir(0,p_Var19,"./empty_dir/",0x1ff,0);
  auStack_b50._472_8_ = (void *)0x1600b6;
  uv_fs_req_cleanup(p_Var19);
  auStack_b50._472_8_ = (void *)0x1600c8;
  memset(p_Var19,0xdb,0x1b8);
  puVar9 = (uv_loop_t *)0x0;
  auStack_b50._472_8_ = (void *)0x1600da;
  iVar4 = uv_fs_scandir(0,p_Var19,"./empty_dir/",0,0);
  if (iVar4 == 0) {
    if (uStack_960.watcher_queue[0] != (void *)0x0) goto LAB_001601dc;
    puVar9 = (uv_loop_t *)uStack_960.watcher_queue[1];
    if ((uv_loop_t *)uStack_960.watcher_queue[1] != (uv_loop_t *)0x0) goto LAB_001601e1;
    puVar9 = (uv_loop_t *)(auStack_b50 + 0x1f0);
    auStack_b50._472_8_ = (void *)0x160109;
    iVar4 = uv_fs_scandir_next(puVar9,auStack_b50 + 0x1e0);
    if (iVar4 != -0xfff) goto LAB_001601e6;
    auStack_b50._472_8_ = (void *)0x16011e;
    uv_fs_req_cleanup(auStack_b50 + 0x1f0);
    auStack_b50._472_8_ = (void *)0x160141;
    puVar9 = loop;
    iVar4 = uv_fs_scandir(loop,&scandir_req,"./empty_dir/",0,empty_scandir_cb);
    if (iVar4 != 0) goto LAB_001601eb;
    if (scandir_cb_count != 0) goto LAB_001601f0;
    auStack_b50._472_8_ = (void *)0x160164;
    puVar9 = loop;
    uv_run(loop,0);
    if (scandir_cb_count != 1) goto LAB_001601f5;
    auStack_b50._472_8_ = (void *)0x160189;
    uv_fs_rmdir(0,auStack_b50 + 0x1f0,"./empty_dir/",0);
    auStack_b50._472_8_ = (void *)0x160191;
    uv_fs_req_cleanup(auStack_b50 + 0x1f0);
    auStack_b50._472_8_ = (void *)0x160196;
    pcVar15 = (char *)uv_default_loop();
    auStack_b50._472_8_ = (void *)0x1601aa;
    uv_walk(pcVar15,close_walk_cb,0);
    auStack_b50._472_8_ = (void *)0x1601b4;
    uv_run(pcVar15,0);
    auStack_b50._472_8_ = (void *)0x1601b9;
    puVar9 = (uv_loop_t *)uv_default_loop();
    auStack_b50._472_8_ = (void *)0x1601c1;
    iVar4 = uv_loop_close();
    if (iVar4 == 0) {
      auStack_b50._472_8_ = (void *)0x1601ca;
      uv_library_shutdown();
      return;
    }
  }
  else {
    auStack_b50._472_8_ = (void *)0x1601dc;
    run_test_fs_scandir_empty_dir_cold_1();
LAB_001601dc:
    auStack_b50._472_8_ = (void *)0x1601e1;
    run_test_fs_scandir_empty_dir_cold_2();
LAB_001601e1:
    auStack_b50._472_8_ = (void *)0x1601e6;
    run_test_fs_scandir_empty_dir_cold_3();
LAB_001601e6:
    auStack_b50._472_8_ = (void *)0x1601eb;
    run_test_fs_scandir_empty_dir_cold_4();
LAB_001601eb:
    auStack_b50._472_8_ = (void *)0x1601f0;
    run_test_fs_scandir_empty_dir_cold_5();
LAB_001601f0:
    auStack_b50._472_8_ = (void *)0x1601f5;
    run_test_fs_scandir_empty_dir_cold_6();
LAB_001601f5:
    auStack_b50._472_8_ = (void *)0x1601fa;
    run_test_fs_scandir_empty_dir_cold_7();
  }
  auStack_b50._472_8_ = empty_scandir_cb;
  run_test_fs_scandir_empty_dir_cold_8();
  if (puVar9 == (uv_loop_t *)&scandir_req) {
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_00160262;
    if (scandir_req.result != 0) goto LAB_00160267;
    if (scandir_req.ptr != (void *)0x0) goto LAB_0016026c;
    auStack_b50._448_8_ = (_func_void *)0x16023f;
    iVar4 = uv_fs_scandir_next(&scandir_req,auStack_b50 + 0x1d0);
    if (iVar4 == -0xfff) {
      auStack_b50._448_8_ = (_func_void *)0x160252;
      uv_fs_req_cleanup(&scandir_req);
      scandir_cb_count = scandir_cb_count + 1;
      return;
    }
  }
  else {
    auStack_b50._448_8_ = (_func_void *)0x160262;
    empty_scandir_cb_cold_1();
LAB_00160262:
    auStack_b50._448_8_ = (_func_void *)0x160267;
    empty_scandir_cb_cold_2();
LAB_00160267:
    auStack_b50._448_8_ = (_func_void *)0x16026c;
    empty_scandir_cb_cold_3();
LAB_0016026c:
    auStack_b50._448_8_ = (_func_void *)0x160271;
    empty_scandir_cb_cold_4();
  }
  auStack_b50._448_8_ = run_test_fs_scandir_non_existent_dir;
  empty_scandir_cb_cold_5();
  pcStack_b68 = (code *)0x160285;
  auStack_b50._440_8_ = pcVar15;
  auStack_b50._448_8_ = p_Var19;
  loop = (uv_loop_t *)uv_default_loop();
  pcVar15 = "./non_existent_dir/";
  __s = (uv_fs_t *)auStack_b50;
  pcStack_b68 = (code *)0x1602a7;
  uv_fs_rmdir(0,__s,"./non_existent_dir/",0);
  pcStack_b68 = (code *)0x1602af;
  uv_fs_req_cleanup(__s);
  pcStack_b68 = (code *)0x1602c1;
  memset(__s,0xdb,0x1b8);
  puVar9 = (uv_loop_t *)0x0;
  pcStack_b68 = (code *)0x1602d3;
  iVar4 = uv_fs_scandir(0,__s,"./non_existent_dir/",0,0);
  if (iVar4 == -2) {
    if ((void *)auStack_b50._88_8_ != (void *)0xfffffffffffffffe) goto LAB_001603a8;
    puVar9 = (uv_loop_t *)auStack_b50._96_8_;
    if ((uv_loop_t *)auStack_b50._96_8_ != (uv_loop_t *)0x0) goto LAB_001603ad;
    puVar9 = (uv_loop_t *)auStack_b50;
    pcStack_b68 = (code *)0x160303;
    iVar4 = uv_fs_scandir_next(puVar9,auStack_b60);
    if (iVar4 != -2) goto LAB_001603b2;
    pcStack_b68 = (code *)0x160316;
    uv_fs_req_cleanup(auStack_b50);
    pcStack_b68 = (code *)0x160339;
    puVar9 = loop;
    iVar4 = uv_fs_scandir(loop,&scandir_req,"./non_existent_dir/",0,non_existent_scandir_cb);
    if (iVar4 != 0) goto LAB_001603b7;
    if (scandir_cb_count != 0) goto LAB_001603bc;
    pcStack_b68 = (code *)0x160354;
    puVar9 = loop;
    uv_run(loop,0);
    if (scandir_cb_count != 1) goto LAB_001603c1;
    pcStack_b68 = (code *)0x160362;
    pcVar15 = (char *)uv_default_loop();
    pcStack_b68 = (code *)0x160376;
    uv_walk(pcVar15,close_walk_cb,0);
    pcStack_b68 = (code *)0x160380;
    uv_run(pcVar15,0);
    pcStack_b68 = (code *)0x160385;
    puVar9 = (uv_loop_t *)uv_default_loop();
    pcStack_b68 = (code *)0x16038d;
    iVar4 = uv_loop_close();
    if (iVar4 == 0) {
      pcStack_b68 = (code *)0x160396;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_b68 = (code *)0x1603a8;
    run_test_fs_scandir_non_existent_dir_cold_1();
LAB_001603a8:
    pcStack_b68 = (code *)0x1603ad;
    run_test_fs_scandir_non_existent_dir_cold_2();
LAB_001603ad:
    pcStack_b68 = (code *)0x1603b2;
    run_test_fs_scandir_non_existent_dir_cold_3();
LAB_001603b2:
    pcStack_b68 = (code *)0x1603b7;
    run_test_fs_scandir_non_existent_dir_cold_4();
LAB_001603b7:
    pcStack_b68 = (code *)0x1603bc;
    run_test_fs_scandir_non_existent_dir_cold_5();
LAB_001603bc:
    pcStack_b68 = (code *)0x1603c1;
    run_test_fs_scandir_non_existent_dir_cold_6();
LAB_001603c1:
    pcStack_b68 = (code *)0x1603c6;
    run_test_fs_scandir_non_existent_dir_cold_7();
  }
  pcStack_b68 = non_existent_scandir_cb;
  run_test_fs_scandir_non_existent_dir_cold_8();
  if (puVar9 == (uv_loop_t *)&scandir_req) {
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_0016042c;
    if (scandir_req.result != -2) goto LAB_00160431;
    if (scandir_req.ptr != (void *)0x0) goto LAB_00160436;
    puStack_b80 = (uv_fs_t *)0x16040b;
    iVar4 = uv_fs_scandir_next(&scandir_req,auStack_b70);
    if (iVar4 == -2) {
      puStack_b80 = (uv_fs_t *)0x16041c;
      uv_fs_req_cleanup(&scandir_req);
      scandir_cb_count = scandir_cb_count + 1;
      return;
    }
  }
  else {
    puStack_b80 = (uv_fs_t *)0x16042c;
    non_existent_scandir_cb_cold_1();
LAB_0016042c:
    puStack_b80 = (uv_fs_t *)0x160431;
    non_existent_scandir_cb_cold_2();
LAB_00160431:
    puStack_b80 = (uv_fs_t *)0x160436;
    non_existent_scandir_cb_cold_3();
LAB_00160436:
    puStack_b80 = (uv_fs_t *)0x16043b;
    non_existent_scandir_cb_cold_4();
  }
  puStack_b80 = (uv_fs_t *)run_test_fs_scandir_file;
  non_existent_scandir_cb_cold_5();
  pcStack_b88 = (code *)0x160446;
  puStack_b80 = (uv_fs_t *)pcVar15;
  loop = (uv_loop_t *)uv_default_loop();
  puVar9 = (uv_loop_t *)0x0;
  pcStack_b88 = (code *)0x160467;
  iVar4 = uv_fs_scandir(0,&scandir_req,"test/fixtures/empty_file",0,0);
  if (iVar4 == -0x14) {
    puVar16 = &scandir_req;
    pcStack_b88 = (code *)0x16047f;
    uv_fs_req_cleanup(&scandir_req);
    pcStack_b88 = (code *)0x16049e;
    puVar9 = loop;
    iVar4 = uv_fs_scandir(loop,&scandir_req,"test/fixtures/empty_file",0,file_scandir_cb);
    if (iVar4 != 0) goto LAB_00160504;
    if (scandir_cb_count != 0) goto LAB_00160509;
    pcStack_b88 = (code *)0x1604b9;
    puVar9 = loop;
    uv_run(loop,0);
    if (scandir_cb_count != 1) goto LAB_0016050e;
    pcStack_b88 = (code *)0x1604c7;
    puVar16 = (uv_fs_t *)uv_default_loop();
    pcStack_b88 = (code *)0x1604db;
    uv_walk(puVar16,close_walk_cb,0);
    pcStack_b88 = (code *)0x1604e5;
    uv_run(puVar16,0);
    pcStack_b88 = (code *)0x1604ea;
    puVar9 = (uv_loop_t *)uv_default_loop();
    pcStack_b88 = (code *)0x1604f2;
    iVar4 = uv_loop_close();
    if (iVar4 == 0) {
      pcStack_b88 = (code *)0x1604fb;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_b88 = (code *)0x160504;
    run_test_fs_scandir_file_cold_1();
    puVar16 = (uv_fs_t *)pcVar15;
LAB_00160504:
    pcStack_b88 = (code *)0x160509;
    run_test_fs_scandir_file_cold_2();
LAB_00160509:
    pcStack_b88 = (code *)0x16050e;
    run_test_fs_scandir_file_cold_3();
LAB_0016050e:
    pcStack_b88 = (code *)0x160513;
    run_test_fs_scandir_file_cold_4();
  }
  pcStack_b88 = file_scandir_cb;
  run_test_fs_scandir_file_cold_5();
  if (puVar9 == (uv_loop_t *)&scandir_req) {
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_0016055d;
    if (scandir_req.result != -0x14) goto LAB_00160562;
    if (scandir_req.ptr == (void *)0x0) {
      puStack_b90 = (uv_fs_t *)0x160550;
      uv_fs_req_cleanup(&scandir_req);
      scandir_cb_count = scandir_cb_count + 1;
      return;
    }
  }
  else {
    puStack_b90 = (uv_fs_t *)0x16055d;
    file_scandir_cb_cold_1();
LAB_0016055d:
    puStack_b90 = (uv_fs_t *)0x160562;
    file_scandir_cb_cold_2();
LAB_00160562:
    puStack_b90 = (uv_fs_t *)0x160567;
    file_scandir_cb_cold_3();
  }
  puStack_b90 = (uv_fs_t *)run_test_fs_open_dir;
  file_scandir_cb_cold_4();
  pcStack_d58 = (code *)0x16057b;
  puStack_b98 = puVar16;
  puStack_b90 = __s;
  loop = (uv_loop_t *)uv_default_loop();
  puVar9 = (uv_loop_t *)0x0;
  pcStack_d58 = (code *)0x16059b;
  uVar3 = uv_fs_open(0,&uStack_d50,".",0,0,0);
  if ((int)uVar3 < 0) {
    pcStack_d58 = (code *)0x160671;
    run_test_fs_open_dir_cold_1();
LAB_00160671:
    pcStack_d58 = (code *)0x160676;
    run_test_fs_open_dir_cold_2();
LAB_00160676:
    pcStack_d58 = (code *)0x16067b;
    run_test_fs_open_dir_cold_3();
LAB_0016067b:
    pcStack_d58 = (code *)0x160680;
    run_test_fs_open_dir_cold_4();
LAB_00160680:
    pcStack_d58 = (code *)0x160685;
    run_test_fs_open_dir_cold_5();
LAB_00160685:
    pcStack_d58 = (code *)0x16068a;
    run_test_fs_open_dir_cold_6();
LAB_0016068a:
    pcStack_d58 = (code *)0x16068f;
    run_test_fs_open_dir_cold_7();
  }
  else {
    if (uStack_d50.result < 0) goto LAB_00160671;
    puVar9 = (uv_loop_t *)uStack_d50.ptr;
    if ((uv_loop_t *)uStack_d50.ptr != (uv_loop_t *)0x0) goto LAB_00160676;
    puVar16 = (uv_fs_t *)(ulong)uVar3;
    pcStack_d58 = (code *)0x1605ca;
    uv_fs_req_cleanup();
    puVar9 = (uv_loop_t *)0x0;
    pcStack_d58 = (code *)0x1605d8;
    iVar4 = uv_fs_close(0,&uStack_d50,puVar16,0);
    __s = &uStack_d50;
    if (iVar4 != 0) goto LAB_0016067b;
    pcStack_d58 = (code *)0x160602;
    puVar9 = loop;
    iVar4 = uv_fs_open(loop,&uStack_d50,".",0,0,open_cb_simple);
    __s = &uStack_d50;
    if (iVar4 != 0) goto LAB_00160680;
    __s = &uStack_d50;
    if (open_cb_count != 0) goto LAB_00160685;
    pcStack_d58 = (code *)0x16061d;
    puVar9 = loop;
    uv_run(loop,0);
    __s = &uStack_d50;
    if (open_cb_count != 1) goto LAB_0016068a;
    pcStack_d58 = (code *)0x16062b;
    puVar16 = (uv_fs_t *)uv_default_loop();
    pcStack_d58 = (code *)0x16063f;
    uv_walk(puVar16,close_walk_cb,0);
    pcStack_d58 = (code *)0x160649;
    uv_run(puVar16,0);
    pcStack_d58 = (code *)0x16064e;
    puVar9 = (uv_loop_t *)uv_default_loop();
    pcStack_d58 = (code *)0x160656;
    iVar4 = uv_loop_close();
    __s = &uStack_d50;
    if (iVar4 == 0) {
      pcStack_d58 = (code *)0x16065f;
      uv_library_shutdown();
      return;
    }
  }
  pcStack_d58 = open_cb_simple;
  run_test_fs_open_dir_cold_8();
  if (puVar9->backend_fd == 1) {
    puVar10 = (uv_loop_t *)puVar9->watcher_queue[0];
    if ((long)puVar10 < 0) goto LAB_001606bc;
    open_cb_count = open_cb_count + 1;
    puVar10 = puVar9;
    if (puVar9->watchers != (uv__io_t **)0x0) {
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    puStack_d60 = (uv_fs_t *)0x1606bc;
    open_cb_simple_cold_1();
    puVar10 = extraout_RAX;
LAB_001606bc:
    puStack_d60 = (uv_fs_t *)0x1606c4;
    open_cb_simple_cold_3();
  }
  iVar4 = (int)puVar10;
  puStack_d60 = (uv_fs_t *)run_test_fs_file_open_append;
  open_cb_simple_cold_2();
  pcStack_d68 = (code *)0x1606cf;
  puStack_d60 = puVar16;
  fs_file_open_append(iVar4);
  pcStack_d68 = (code *)0x1606d4;
  fs_file_open_append(iVar4);
  pcStack_d68 = (code *)0x1606d9;
  uVar7 = uv_default_loop();
  pcStack_d68 = (code *)0x1606ed;
  uv_walk(uVar7,close_walk_cb,0);
  pcStack_d68 = (code *)0x1606f7;
  uv_run(uVar7,0);
  pcStack_d68 = (code *)0x1606fc;
  uVar11 = uv_default_loop();
  pcStack_d68 = (code *)0x160704;
  iVar4 = uv_loop_close(uVar11);
  if (iVar4 == 0) {
    pcStack_d68 = (code *)0x16070d;
    uv_library_shutdown();
    return;
  }
  pcStack_d68 = fs_file_open_append;
  run_test_fs_file_open_append_cold_1();
  pcVar15 = "test_file";
  pcStack_d80 = (code *)0x16072a;
  pcStack_d68 = (code *)uVar7;
  unlink("test_file");
  pcStack_d80 = (code *)0x16072f;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_d80 = (code *)0x160755;
  iVar4 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar4 < 0) {
    pcStack_d80 = (code *)0x160a4a;
    fs_file_open_append_cold_1();
LAB_00160a4a:
    pcStack_d80 = (code *)0x160a4f;
    fs_file_open_append_cold_2();
LAB_00160a4f:
    pcStack_d80 = (code *)0x160a54;
    fs_file_open_append_cold_3();
LAB_00160a54:
    pcStack_d80 = (code *)0x160a59;
    fs_file_open_append_cold_4();
LAB_00160a59:
    pcStack_d80 = (code *)0x160a5e;
    fs_file_open_append_cold_5();
LAB_00160a5e:
    pcStack_d80 = (code *)0x160a63;
    fs_file_open_append_cold_6();
LAB_00160a63:
    pcStack_d80 = (code *)0x160a68;
    fs_file_open_append_cold_7();
LAB_00160a68:
    pcStack_d80 = (code *)0x160a6d;
    fs_file_open_append_cold_8();
LAB_00160a6d:
    pcStack_d80 = (code *)0x160a72;
    fs_file_open_append_cold_9();
LAB_00160a72:
    pcStack_d80 = (code *)0x160a77;
    fs_file_open_append_cold_10();
LAB_00160a77:
    pcStack_d80 = (code *)0x160a7c;
    fs_file_open_append_cold_11();
LAB_00160a7c:
    pcStack_d80 = (code *)0x160a81;
    fs_file_open_append_cold_12();
LAB_00160a81:
    pcStack_d80 = (code *)0x160a86;
    fs_file_open_append_cold_13();
LAB_00160a86:
    pcStack_d80 = (code *)0x160a8b;
    fs_file_open_append_cold_14();
LAB_00160a8b:
    pcStack_d80 = (code *)0x160a90;
    fs_file_open_append_cold_15();
LAB_00160a90:
    pcStack_d80 = (code *)0x160a95;
    fs_file_open_append_cold_16();
LAB_00160a95:
    pcStack_d80 = (code *)0x160a9a;
    fs_file_open_append_cold_17();
LAB_00160a9a:
    pcStack_d80 = (code *)0x160a9f;
    fs_file_open_append_cold_18();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00160a4a;
    pcStack_d80 = (code *)0x160777;
    uv_fs_req_cleanup(&open_req1);
    pcStack_d80 = (code *)0x160788;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_d78 = 0;
    pcStack_d80 = (code *)0x1607c6;
    iVar4 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar4 < 0) goto LAB_00160a4f;
    if (write_req.result < 0) goto LAB_00160a54;
    pcStack_d80 = (code *)0x1607e8;
    uv_fs_req_cleanup(&write_req);
    pcStack_d80 = (code *)0x1607fe;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar4 != 0) goto LAB_00160a59;
    if (close_req.result != 0) goto LAB_00160a5e;
    pcStack_d80 = (code *)0x160820;
    uv_fs_req_cleanup(&close_req);
    pcStack_d80 = (code *)0x160840;
    iVar4 = uv_fs_open(0,&open_req1,"test_file",0x402,0,0);
    if (iVar4 < 0) goto LAB_00160a63;
    if (open_req1.result._4_4_ < 0) goto LAB_00160a68;
    pcStack_d80 = (code *)0x160862;
    uv_fs_req_cleanup(&open_req1);
    pcStack_d80 = (code *)0x160873;
    uVar24 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_d78 = 0;
    pcStack_d80 = (code *)0x1608b1;
    iov = uVar24;
    iVar4 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar4 < 0) goto LAB_00160a6d;
    if (write_req.result < 0) goto LAB_00160a72;
    pcStack_d80 = (code *)0x1608d3;
    uv_fs_req_cleanup(&write_req);
    pcStack_d80 = (code *)0x1608e9;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar4 != 0) goto LAB_00160a77;
    if (close_req.result != 0) goto LAB_00160a7c;
    pcStack_d80 = (code *)0x16090b;
    uv_fs_req_cleanup(&close_req);
    pcStack_d80 = (code *)0x16092b;
    iVar4 = uv_fs_open(0,&open_req1,"test_file",0,0x100,0);
    if (iVar4 < 0) goto LAB_00160a81;
    if (open_req1.result._4_4_ < 0) goto LAB_00160a86;
    pcStack_d80 = (code *)0x16094d;
    uv_fs_req_cleanup(&open_req1);
    pcStack_d80 = (code *)0x16095e;
    uVar24 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_d78 = 0;
    pcStack_d80 = (code *)0x16099c;
    iov = uVar24;
    uVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    pcVar15 = (char *)(ulong)uVar3;
    pcStack_d80 = (code *)0x1609ae;
    printf("read = %d\n",(ulong)uVar3);
    if (uVar3 != 0x1a) goto LAB_00160a8b;
    if (read_req.result != 0x1a) goto LAB_00160a90;
    auVar23[0] = -(buf[10] == 'r');
    auVar23[1] = -(buf[0xb] == '\n');
    auVar23[2] = -(buf[0xc] == '\0');
    auVar23[3] = -(buf[0xd] == 't');
    auVar23[4] = -(buf[0xe] == 'e');
    auVar23[5] = -(buf[0xf] == 's');
    auVar23[6] = -(buf[0x10] == 't');
    auVar23[7] = -(buf[0x11] == '-');
    auVar23[8] = -(buf[0x12] == 'b');
    auVar23[9] = -(buf[0x13] == 'u');
    auVar23[10] = -(buf[0x14] == 'f');
    auVar23[0xb] = -(buf[0x15] == 'f');
    auVar23[0xc] = -(buf[0x16] == 'e');
    auVar23[0xd] = -(buf[0x17] == 'r');
    auVar23[0xe] = -(buf[0x18] == '\n');
    auVar23[0xf] = -(buf[0x19] == '\0');
    auVar22[0] = -(buf[0] == 't');
    auVar22[1] = -(buf[1] == 'e');
    auVar22[2] = -(buf[2] == 's');
    auVar22[3] = -(buf[3] == 't');
    auVar22[4] = -(buf[4] == '-');
    auVar22[5] = -(buf[5] == 'b');
    auVar22[6] = -(buf[6] == 'u');
    auVar22[7] = -(buf[7] == 'f');
    auVar22[8] = -(buf[8] == 'f');
    auVar22[9] = -(buf[9] == 'e');
    auVar22[10] = -(buf[10] == 'r');
    auVar22[0xb] = -(buf[0xb] == '\n');
    auVar22[0xc] = -(buf[0xc] == '\0');
    auVar22[0xd] = -(buf[0xd] == 't');
    auVar22[0xe] = -(buf[0xe] == 'e');
    auVar22[0xf] = -(buf[0xf] == 's');
    auVar22 = auVar22 & auVar23;
    if ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00160a95;
    pcStack_d80 = (code *)0x160a04;
    uv_fs_req_cleanup(&read_req);
    pcStack_d80 = (code *)0x160a1a;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar4 != 0) goto LAB_00160a9a;
    if (close_req.result == 0) {
      pcStack_d80 = (code *)0x160a34;
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      return;
    }
  }
  pcStack_d80 = run_test_fs_rename_to_existing_file;
  fs_file_open_append_cold_19();
  pcVar17 = "test_file";
  pcStack_d98 = (code *)0x160ab8;
  pcStack_d80 = (code *)pcVar15;
  unlink("test_file");
  pcStack_d98 = (code *)0x160ac4;
  unlink("test_file2");
  pcStack_d98 = (code *)0x160ac9;
  loop = (uv_loop_t *)uv_default_loop();
  iVar5 = 0;
  pcStack_d98 = (code *)0x160aef;
  iVar4 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar4 < 0) {
    pcStack_d98 = (code *)0x160dea;
    run_test_fs_rename_to_existing_file_cold_1();
LAB_00160dea:
    pcStack_d98 = (code *)0x160def;
    run_test_fs_rename_to_existing_file_cold_2();
LAB_00160def:
    pcStack_d98 = (code *)0x160df4;
    run_test_fs_rename_to_existing_file_cold_3();
LAB_00160df4:
    pcStack_d98 = (code *)0x160df9;
    run_test_fs_rename_to_existing_file_cold_4();
LAB_00160df9:
    pcStack_d98 = (code *)0x160dfe;
    run_test_fs_rename_to_existing_file_cold_5();
LAB_00160dfe:
    pcStack_d98 = (code *)0x160e03;
    run_test_fs_rename_to_existing_file_cold_6();
LAB_00160e03:
    pcStack_d98 = (code *)0x160e08;
    run_test_fs_rename_to_existing_file_cold_7();
LAB_00160e08:
    pcStack_d98 = (code *)0x160e0d;
    run_test_fs_rename_to_existing_file_cold_8();
LAB_00160e0d:
    pcStack_d98 = (code *)0x160e12;
    run_test_fs_rename_to_existing_file_cold_9();
LAB_00160e12:
    pcStack_d98 = (code *)0x160e17;
    run_test_fs_rename_to_existing_file_cold_10();
LAB_00160e17:
    pcStack_d98 = (code *)0x160e1c;
    run_test_fs_rename_to_existing_file_cold_11();
LAB_00160e1c:
    pcStack_d98 = (code *)0x160e21;
    run_test_fs_rename_to_existing_file_cold_12();
LAB_00160e21:
    pcStack_d98 = (code *)0x160e26;
    run_test_fs_rename_to_existing_file_cold_13();
LAB_00160e26:
    pcStack_d98 = (code *)0x160e2b;
    run_test_fs_rename_to_existing_file_cold_14();
LAB_00160e2b:
    pcStack_d98 = (code *)0x160e30;
    run_test_fs_rename_to_existing_file_cold_15();
LAB_00160e30:
    pcStack_d98 = (code *)0x160e35;
    run_test_fs_rename_to_existing_file_cold_16();
LAB_00160e35:
    pcStack_d98 = (code *)0x160e3a;
    run_test_fs_rename_to_existing_file_cold_17();
LAB_00160e3a:
    pcStack_d98 = (code *)0x160e3f;
    run_test_fs_rename_to_existing_file_cold_18();
LAB_00160e3f:
    pcStack_d98 = (code *)0x160e44;
    run_test_fs_rename_to_existing_file_cold_19();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00160dea;
    pcStack_d98 = (code *)0x160b11;
    uv_fs_req_cleanup(&open_req1);
    pcStack_d98 = (code *)0x160b22;
    uVar24 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_d90 = 0;
    iVar5 = 0;
    pcStack_d98 = (code *)0x160b60;
    iov = uVar24;
    iVar4 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar4 < 0) goto LAB_00160def;
    if (write_req.result < 0) goto LAB_00160df4;
    pcStack_d98 = (code *)0x160b82;
    uv_fs_req_cleanup();
    iVar5 = 0;
    pcStack_d98 = (code *)0x160b98;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar4 != 0) goto LAB_00160df9;
    if (close_req.result != 0) goto LAB_00160dfe;
    pcStack_d98 = (code *)0x160bba;
    uv_fs_req_cleanup();
    iVar5 = 0;
    pcStack_d98 = (code *)0x160bdd;
    iVar4 = uv_fs_open(0,&open_req1,"test_file2",0x41,0x180,0);
    if (iVar4 < 0) goto LAB_00160e03;
    if (open_req1.result._4_4_ < 0) goto LAB_00160e08;
    pcStack_d98 = (code *)0x160bff;
    uv_fs_req_cleanup();
    iVar5 = 0;
    pcStack_d98 = (code *)0x160c15;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar4 != 0) goto LAB_00160e0d;
    if (close_req.result != 0) goto LAB_00160e12;
    pcStack_d98 = (code *)0x160c37;
    uv_fs_req_cleanup();
    iVar5 = 0;
    pcStack_d98 = (code *)0x160c56;
    iVar4 = uv_fs_rename(0,&rename_req,"test_file","test_file2",0);
    if (iVar4 != 0) goto LAB_00160e17;
    if (rename_req.result != 0) goto LAB_00160e1c;
    pcStack_d98 = (code *)0x160c78;
    uv_fs_req_cleanup();
    iVar5 = 0;
    pcStack_d98 = (code *)0x160c95;
    iVar4 = uv_fs_open(0,&open_req1,"test_file2",0,0,0);
    if (iVar4 < 0) goto LAB_00160e21;
    if (open_req1.result._4_4_ < 0) goto LAB_00160e26;
    pcStack_d98 = (code *)0x160cb7;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_d98 = (code *)0x160cd9;
    uVar24 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_d90 = 0;
    iVar5 = 0;
    pcStack_d98 = (code *)0x160d17;
    iov = uVar24;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar4 < 0) goto LAB_00160e2b;
    if (read_req.result < 0) goto LAB_00160e30;
    iVar5 = 0x2f84e0;
    pcStack_d98 = (code *)0x160d40;
    iVar4 = strcmp(buf,test_buf);
    if (iVar4 != 0) goto LAB_00160e35;
    pcStack_d98 = (code *)0x160d54;
    uv_fs_req_cleanup();
    iVar5 = 0;
    pcStack_d98 = (code *)0x160d6a;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar4 != 0) goto LAB_00160e3a;
    if (close_req.result != 0) goto LAB_00160e3f;
    pcStack_d98 = (code *)0x160d8c;
    uv_fs_req_cleanup(&close_req);
    pcStack_d98 = (code *)0x160d98;
    unlink("test_file");
    pcStack_d98 = (code *)0x160da4;
    unlink("test_file2");
    pcStack_d98 = (code *)0x160da9;
    pcVar17 = (char *)uv_default_loop();
    pcStack_d98 = (code *)0x160dbd;
    uv_walk(pcVar17,close_walk_cb,0);
    pcStack_d98 = (code *)0x160dc7;
    uv_run(pcVar17,0);
    pcStack_d98 = (code *)0x160dcc;
    iVar5 = uv_default_loop();
    pcStack_d98 = (code *)0x160dd4;
    iVar4 = uv_loop_close();
    if (iVar4 == 0) {
      pcStack_d98 = (code *)0x160ddd;
      uv_library_shutdown();
      return;
    }
  }
  pcStack_d98 = run_test_fs_read_bufs;
  run_test_fs_rename_to_existing_file_cold_20();
  puStack_da0 = (uv_fs_t *)0x160e4f;
  pcStack_d98 = (code *)pcVar17;
  fs_read_bufs(iVar5);
  puStack_da0 = (uv_fs_t *)0x160e54;
  fs_read_bufs(iVar5);
  puStack_da0 = (uv_fs_t *)0x160e59;
  __s1 = (undefined1 *)uv_default_loop();
  puStack_da0 = (uv_fs_t *)0x160e6d;
  uv_walk(__s1,close_walk_cb,0);
  puStack_da0 = (uv_fs_t *)0x160e77;
  uv_run(__s1,0);
  puStack_da0 = (uv_fs_t *)0x160e7c;
  uv_default_loop();
  puStack_da0 = (uv_fs_t *)0x160e84;
  iVar4 = uv_loop_close();
  if (iVar4 == 0) {
    puStack_da0 = (uv_fs_t *)0x160e8d;
    uv_library_shutdown();
    return;
  }
  puStack_da0 = (uv_fs_t *)fs_read_bufs;
  run_test_fs_read_bufs_cold_1();
  iVar5 = 0;
  pcStack_1108 = (code *)0x160ebd;
  puStack_da8 = __s1;
  puStack_da0 = __s;
  iVar4 = uv_fs_open(0,&open_req1,"test/fixtures/lorem_ipsum.txt",0,0,0);
  if (iVar4 < 0) {
    pcStack_1108 = (code *)0x1610f5;
    fs_read_bufs_cold_1();
LAB_001610f5:
    pcStack_1108 = (code *)0x1610fa;
    fs_read_bufs_cold_2();
LAB_001610fa:
    pcStack_1108 = (code *)0x1610ff;
    fs_read_bufs_cold_3();
LAB_001610ff:
    pcStack_1108 = (code *)0x161104;
    fs_read_bufs_cold_4();
LAB_00161104:
    pcStack_1108 = (code *)0x161109;
    fs_read_bufs_cold_5();
LAB_00161109:
    pcStack_1108 = (code *)0x16110e;
    fs_read_bufs_cold_6();
LAB_0016110e:
    pcStack_1108 = (code *)0x161113;
    fs_read_bufs_cold_7();
LAB_00161113:
    pcStack_1108 = (code *)0x161118;
    fs_read_bufs_cold_8();
LAB_00161118:
    pcStack_1108 = (code *)0x16111d;
    fs_read_bufs_cold_9();
LAB_0016111d:
    pcStack_1108 = (code *)0x161122;
    fs_read_bufs_cold_10();
LAB_00161122:
    pcStack_1108 = (code *)0x161127;
    fs_read_bufs_cold_11();
LAB_00161127:
    pcStack_1108 = (code *)0x16112c;
    fs_read_bufs_cold_12();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_001610f5;
    pcStack_1108 = (code *)0x160edf;
    uv_fs_req_cleanup();
    uStack_1100 = 0;
    iVar5 = 0;
    pcStack_1108 = (code *)0x160f03;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,0,0,0);
    if (iVar4 != -0x16) goto LAB_001610fa;
    uStack_1100 = 0;
    iVar5 = 0;
    pcStack_1108 = (code *)0x160f33;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,0,1,0);
    if (iVar4 != -0x16) goto LAB_001610ff;
    uStack_1100 = 0;
    iVar5 = 0;
    pcStack_1108 = (code *)0x160f63;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_10f0,0,0);
    if (iVar4 != -0x16) goto LAB_00161104;
    pcStack_1108 = (code *)0x160f7b;
    auStack_10f0 = uv_buf_init(auStack_10b0,0x100);
    __s1 = auStack_10f0;
    pcStack_1108 = (code *)0x160f99;
    auStack_10e0 = uv_buf_init(auStack_fb0,0x100);
    pcStack_1108 = (code *)0x160fb3;
    auStack_10d0 = uv_buf_init(auStack_eb0,0x80);
    pcStack_1108 = (code *)0x160fcd;
    auStack_10c0 = uv_buf_init(auStack_e30,0x80);
    uStack_1100 = 0;
    iVar5 = 0;
    pcStack_1108 = (code *)0x160ffd;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,__s1,2,0);
    if (iVar4 != 0x1be) goto LAB_00161109;
    if (read_req.result != 0x1be) goto LAB_0016110e;
    __s1 = auStack_10d0;
    __s = &read_req;
    pcStack_1108 = (code *)0x16102d;
    uv_fs_req_cleanup();
    uStack_1100 = 0;
    iVar5 = 0;
    pcStack_1108 = (code *)0x161054;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,__s1,2,0x100);
    if (iVar4 != 0xbe) goto LAB_00161113;
    if (read_req.result != 0xbe) goto LAB_00161118;
    pcStack_1108 = (code *)0x16107c;
    uv_fs_req_cleanup(&read_req);
    __s1 = (undefined1 *)auStack_10e0._0_8_;
    pcStack_1108 = (code *)0x161093;
    puVar18 = (undefined1 *)auStack_10e0._0_8_;
    iVar4 = bcmp((void *)auStack_10e0._0_8_,(void *)auStack_10d0._0_8_,0x80);
    iVar5 = (int)puVar18;
    if (iVar4 != 0) goto LAB_0016111d;
    __s1 = __s1 + 0x80;
    pcStack_1108 = (code *)0x1610b1;
    puVar18 = __s1;
    iVar4 = bcmp(__s1,(void *)auStack_10c0._0_8_,0x3e);
    iVar5 = (int)puVar18;
    if (iVar4 != 0) goto LAB_00161122;
    iVar5 = 0;
    pcStack_1108 = (code *)0x1610cb;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar4 != 0) goto LAB_00161127;
    if (close_req.result == 0) {
      pcStack_1108 = (code *)0x1610e5;
      uv_fs_req_cleanup(&close_req);
      return;
    }
  }
  pcStack_1108 = run_test_fs_read_file_eof;
  fs_read_bufs_cold_13();
  pcStack_1110 = (code *)0x161137;
  pcStack_1108 = (code *)__s1;
  fs_read_file_eof(iVar5);
  pcStack_1110 = (code *)0x16113c;
  fs_read_file_eof(iVar5);
  pcStack_1110 = (code *)0x161141;
  uVar7 = uv_default_loop();
  pcStack_1110 = (code *)0x161155;
  uv_walk(uVar7,close_walk_cb,0);
  pcStack_1110 = (code *)0x16115f;
  uv_run(uVar7,0);
  pcStack_1110 = (code *)0x161164;
  uVar11 = uv_default_loop();
  pcStack_1110 = (code *)0x16116c;
  iVar4 = uv_loop_close(uVar11);
  if (iVar4 == 0) {
    pcStack_1110 = (code *)0x161175;
    uv_library_shutdown();
    return;
  }
  pcStack_1110 = fs_read_file_eof;
  run_test_fs_read_file_eof_cold_1();
  puVar16 = (uv_fs_t *)0x193567;
  puStack_1128 = (uv_fs_t *)0x161192;
  pcStack_1110 = (code *)uVar7;
  unlink("test_file");
  puStack_1128 = (uv_fs_t *)0x161197;
  loop = (uv_loop_t *)uv_default_loop();
  iVar5 = 0;
  puStack_1128 = (uv_fs_t *)0x1611bd;
  iVar4 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar4 < 0) {
    puStack_1128 = (uv_fs_t *)0x16141a;
    fs_read_file_eof_cold_1();
LAB_0016141a:
    puStack_1128 = (uv_fs_t *)0x16141f;
    fs_read_file_eof_cold_2();
LAB_0016141f:
    puStack_1128 = (uv_fs_t *)0x161424;
    fs_read_file_eof_cold_3();
LAB_00161424:
    puStack_1128 = (uv_fs_t *)0x161429;
    fs_read_file_eof_cold_4();
LAB_00161429:
    puStack_1128 = (uv_fs_t *)0x16142e;
    fs_read_file_eof_cold_5();
LAB_0016142e:
    puStack_1128 = (uv_fs_t *)0x161433;
    fs_read_file_eof_cold_6();
LAB_00161433:
    puStack_1128 = (uv_fs_t *)0x161438;
    fs_read_file_eof_cold_7();
LAB_00161438:
    puStack_1128 = (uv_fs_t *)0x16143d;
    fs_read_file_eof_cold_8();
LAB_0016143d:
    puStack_1128 = (uv_fs_t *)0x161442;
    fs_read_file_eof_cold_9();
LAB_00161442:
    puStack_1128 = (uv_fs_t *)0x161447;
    fs_read_file_eof_cold_10();
LAB_00161447:
    puStack_1128 = (uv_fs_t *)0x16144c;
    fs_read_file_eof_cold_11();
LAB_0016144c:
    puStack_1128 = (uv_fs_t *)0x161451;
    fs_read_file_eof_cold_12();
LAB_00161451:
    puStack_1128 = (uv_fs_t *)0x161456;
    fs_read_file_eof_cold_13();
LAB_00161456:
    puStack_1128 = (uv_fs_t *)0x16145b;
    fs_read_file_eof_cold_14();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0016141a;
    puStack_1128 = (uv_fs_t *)0x1611df;
    uv_fs_req_cleanup(&open_req1);
    puStack_1128 = (uv_fs_t *)0x1611f0;
    uVar24 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_1120 = 0;
    iVar5 = 0;
    puStack_1128 = (uv_fs_t *)0x16122e;
    iov = uVar24;
    iVar4 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar4 < 0) goto LAB_0016141f;
    if (write_req.result < 0) goto LAB_00161424;
    puStack_1128 = (uv_fs_t *)0x161250;
    uv_fs_req_cleanup();
    iVar5 = 0;
    puStack_1128 = (uv_fs_t *)0x161266;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar4 != 0) goto LAB_00161429;
    if (close_req.result != 0) goto LAB_0016142e;
    puStack_1128 = (uv_fs_t *)0x161288;
    uv_fs_req_cleanup();
    iVar5 = 0;
    puStack_1128 = (uv_fs_t *)0x1612a5;
    iVar4 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar4 < 0) goto LAB_00161433;
    if (open_req1.result._4_4_ < 0) goto LAB_00161438;
    puStack_1128 = (uv_fs_t *)0x1612c7;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    puStack_1128 = (uv_fs_t *)0x1612e9;
    uVar24 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_1120 = 0;
    iVar5 = 0;
    puStack_1128 = (uv_fs_t *)0x161327;
    iov = uVar24;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar4 < 0) goto LAB_0016143d;
    if (read_req.result < 0) goto LAB_00161442;
    iVar5 = 0x2f84e0;
    puStack_1128 = (uv_fs_t *)0x161350;
    iVar4 = strcmp(buf,test_buf);
    if (iVar4 != 0) goto LAB_00161447;
    puVar16 = &read_req;
    puStack_1128 = (uv_fs_t *)0x161367;
    uv_fs_req_cleanup(&read_req);
    puStack_1128 = (uv_fs_t *)0x161378;
    uVar24 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_1120 = 0;
    iVar5 = 0;
    puStack_1128 = (uv_fs_t *)0x1613b2;
    iov = uVar24;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,read_req.result);
    if (iVar4 != 0) goto LAB_0016144c;
    if (read_req.result != 0) goto LAB_00161451;
    puStack_1128 = (uv_fs_t *)0x1613d4;
    uv_fs_req_cleanup();
    iVar5 = 0;
    puStack_1128 = (uv_fs_t *)0x1613ea;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar4 != 0) goto LAB_00161456;
    if (close_req.result == 0) {
      puStack_1128 = (uv_fs_t *)0x161404;
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      return;
    }
  }
  puStack_1128 = (uv_fs_t *)run_test_fs_write_multiple_bufs;
  fs_read_file_eof_cold_15();
  puStack_1130 = (uv_fs_t *)0x161466;
  puStack_1128 = puVar16;
  fs_write_multiple_bufs(iVar5);
  puStack_1130 = (uv_fs_t *)0x16146b;
  fs_write_multiple_bufs(iVar5);
  puStack_1130 = (uv_fs_t *)0x161470;
  uVar7 = uv_default_loop();
  puStack_1130 = (uv_fs_t *)0x161484;
  uv_walk(uVar7,close_walk_cb,0);
  puStack_1130 = (uv_fs_t *)0x16148e;
  uv_run(uVar7,0);
  puStack_1130 = (uv_fs_t *)0x161493;
  uVar11 = uv_default_loop();
  puStack_1130 = (uv_fs_t *)0x16149b;
  iVar4 = uv_loop_close(uVar11);
  if (iVar4 == 0) {
    puStack_1130 = (uv_fs_t *)0x1614a4;
    uv_library_shutdown();
    return;
  }
  puStack_1130 = (uv_fs_t *)fs_write_multiple_bufs;
  run_test_fs_write_multiple_bufs_cold_1();
  uStack_1138 = uVar7;
  puStack_1130 = __s;
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar4 = 0;
  iVar5 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar5 < 0) {
    fs_write_multiple_bufs_cold_1();
LAB_00161940:
    fs_write_multiple_bufs_cold_2();
LAB_00161945:
    fs_write_multiple_bufs_cold_3();
LAB_0016194a:
    fs_write_multiple_bufs_cold_4();
LAB_0016194f:
    fs_write_multiple_bufs_cold_5();
LAB_00161954:
    fs_write_multiple_bufs_cold_6();
LAB_00161959:
    fs_write_multiple_bufs_cold_7();
LAB_0016195e:
    fs_write_multiple_bufs_cold_8();
LAB_00161963:
    fs_write_multiple_bufs_cold_9();
LAB_00161968:
    fs_write_multiple_bufs_cold_10();
LAB_0016196d:
    fs_write_multiple_bufs_cold_11();
LAB_00161972:
    fs_write_multiple_bufs_cold_12();
LAB_00161977:
    fs_write_multiple_bufs_cold_13();
LAB_0016197c:
    fs_write_multiple_bufs_cold_14();
LAB_00161981:
    fs_write_multiple_bufs_cold_15();
LAB_00161986:
    fs_write_multiple_bufs_cold_16();
LAB_0016198b:
    fs_write_multiple_bufs_cold_19();
LAB_00161990:
    fs_write_multiple_bufs_cold_20();
LAB_00161995:
    fs_write_multiple_bufs_cold_21();
LAB_0016199a:
    fs_write_multiple_bufs_cold_22();
LAB_0016199f:
    fs_write_multiple_bufs_cold_23();
LAB_001619a4:
    fs_write_multiple_bufs_cold_24();
LAB_001619a9:
    fs_write_multiple_bufs_cold_25();
LAB_001619ae:
    fs_write_multiple_bufs_cold_17();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00161940;
    uv_fs_req_cleanup(&open_req1);
    auStack_1160 = uv_buf_init(test_buf,0xd);
    auStack_1150 = uv_buf_init(test_buf2,0xf);
    iVar4 = 0;
    iVar5 = uv_fs_write(0,&write_req,(int)open_req1.result,auStack_1160,2,0);
    if (iVar5 < 0) goto LAB_00161945;
    if (write_req.result < 0) goto LAB_0016194a;
    uv_fs_req_cleanup();
    iVar4 = 0;
    iVar5 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar5 != 0) goto LAB_0016194f;
    if (close_req.result != 0) goto LAB_00161954;
    uv_fs_req_cleanup();
    iVar4 = 0;
    iVar5 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar5 < 0) goto LAB_00161959;
    if (open_req1.result._4_4_ < 0) goto LAB_0016195e;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf2[0] = '\0';
    buf2[1] = '\0';
    buf2[2] = '\0';
    buf2[3] = '\0';
    buf2[4] = '\0';
    buf2[5] = '\0';
    buf2[6] = '\0';
    buf2[7] = '\0';
    buf2[8] = '\0';
    buf2[9] = '\0';
    buf2[10] = '\0';
    buf2[0xb] = '\0';
    buf2[0xc] = '\0';
    buf2[0xd] = '\0';
    buf2[0xe] = '\0';
    buf2[0xf] = '\0';
    buf2[0x10] = '\0';
    buf2[0x11] = '\0';
    buf2[0x12] = '\0';
    buf2[0x13] = '\0';
    buf2[0x14] = '\0';
    buf2[0x15] = '\0';
    buf2[0x16] = '\0';
    buf2[0x17] = '\0';
    buf2[0x18] = '\0';
    buf2[0x19] = '\0';
    buf2[0x1a] = '\0';
    buf2[0x1b] = '\0';
    buf2[0x1c] = '\0';
    buf2[0x1d] = '\0';
    buf2[0x1e] = '\0';
    buf2[0x1f] = '\0';
    auVar22 = uv_buf_init(buf,0xd);
    auStack_1160 = auVar22;
    auVar22 = uv_buf_init(buf2);
    iVar4 = (int)open_req1.result;
    auStack_1150 = auVar22;
    _Var12 = lseek64((int)open_req1.result,0,1);
    if (_Var12 != 0) goto LAB_00161963;
    iVar4 = 0;
    iVar5 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_1160,2,0xffffffffffffffff);
    if (iVar5 < 0) goto LAB_00161968;
    if (read_req.result != 0x1c) goto LAB_0016196d;
    iVar4 = 0x2f84e0;
    iVar5 = strcmp(buf,test_buf);
    if (iVar5 != 0) goto LAB_00161972;
    iVar4 = 0x2fa4d0;
    iVar5 = strcmp(buf2,test_buf2);
    if (iVar5 != 0) goto LAB_00161977;
    uv_fs_req_cleanup(&read_req);
    uVar24 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar4 = 0;
    iov = uVar24;
    iVar5 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar5 != 0) goto LAB_0016197c;
    if (read_req.result != 0) goto LAB_00161981;
    uv_fs_req_cleanup(&read_req);
    auVar22 = uv_buf_init(buf,0xd);
    auStack_1160 = auVar22;
    auVar22 = uv_buf_init(buf2,0xf);
    iVar4 = 0;
    auStack_1150 = auVar22;
    iVar5 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_1160,2,0);
    if (iVar5 < 0) goto LAB_00161986;
    if (read_req.result == 0x1c) {
LAB_0016183e:
      iVar4 = 0x2f84e0;
      iVar5 = strcmp(buf,test_buf);
      if (iVar5 != 0) goto LAB_0016198b;
      iVar4 = 0x2fa4d0;
      iVar5 = strcmp(buf2,test_buf2);
      if (iVar5 != 0) goto LAB_00161990;
      uv_fs_req_cleanup(&read_req);
      uVar24 = (uv_buf_t)uv_buf_init(buf,0x20);
      iVar4 = 0;
      iov = uVar24;
      iVar5 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0x1c);
      if (iVar5 != 0) goto LAB_00161995;
      if (read_req.result != 0) goto LAB_0016199a;
      uv_fs_req_cleanup();
      iVar4 = 0;
      iVar5 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
      if (iVar5 != 0) goto LAB_0016199f;
      if (close_req.result == 0) {
        uv_fs_req_cleanup(&close_req);
        unlink("test_file");
        return;
      }
      goto LAB_001619a4;
    }
    if (read_req.result != 0xd) goto LAB_001619a9;
    uv_fs_req_cleanup();
    iVar4 = 0;
    iVar5 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_1150,1,read_req.result);
    if (iVar5 < 0) goto LAB_001619ae;
    if (read_req.result == 0xf) goto LAB_0016183e;
  }
  fs_write_multiple_bufs_cold_18();
  fs_write_alotof_bufs(iVar4);
  fs_write_alotof_bufs(iVar4);
  uVar7 = uv_default_loop();
  uv_walk(uVar7,close_walk_cb,0);
  uv_run(uVar7,0);
  uVar7 = uv_default_loop();
  iVar4 = uv_loop_close(uVar7);
  if (iVar4 == 0) {
    uv_library_shutdown();
    return;
  }
  run_test_fs_write_alotof_bufs_cold_1();
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar4 = 0xd4310;
  pvVar13 = malloc(0xd4310);
  if (pvVar13 == (void *)0x0) {
LAB_00161d35:
    fs_write_alotof_bufs_cold_18();
LAB_00161d3a:
    fs_write_alotof_bufs_cold_1();
LAB_00161d3f:
    fs_write_alotof_bufs_cold_2();
LAB_00161d44:
    fs_write_alotof_bufs_cold_3();
LAB_00161d49:
    fs_write_alotof_bufs_cold_4();
LAB_00161d4e:
    fs_write_alotof_bufs_cold_17();
LAB_00161d53:
    fs_write_alotof_bufs_cold_5();
LAB_00161d58:
    fs_write_alotof_bufs_cold_6();
LAB_00161d5d:
    fs_write_alotof_bufs_cold_7();
LAB_00161d62:
    fs_write_alotof_bufs_cold_8();
LAB_00161d67:
    fs_write_alotof_bufs_cold_9();
LAB_00161d6c:
    fs_write_alotof_bufs_cold_10();
LAB_00161d71:
    fs_write_alotof_bufs_cold_12();
LAB_00161d76:
    fs_write_alotof_bufs_cold_13();
LAB_00161d7b:
    fs_write_alotof_bufs_cold_14();
LAB_00161d80:
    fs_write_alotof_bufs_cold_15();
  }
  else {
    iVar4 = 0;
    iVar5 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar5 < 0) goto LAB_00161d3a;
    if (open_req1.result._4_4_ < 0) goto LAB_00161d3f;
    uv_fs_req_cleanup(&open_req1);
    lVar20 = 8;
    do {
      auVar22 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar13 + lVar20 + -8) = auVar22._0_8_;
      *(long *)((long)pvVar13 + lVar20) = auVar22._8_8_;
      lVar20 = lVar20 + 0x10;
    } while (lVar20 != 0xd4318);
    iVar4 = 0;
    iVar5 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar13,0xd431,0xffffffffffffffff);
    if (iVar5 < 0) goto LAB_00161d44;
    if (write_req.result != 0xac67d) goto LAB_00161d49;
    uv_fs_req_cleanup(&write_req);
    iVar4 = 0xac67d;
    pvVar14 = malloc(0xac67d);
    if (pvVar14 == (void *)0x0) goto LAB_00161d4e;
    lVar20 = 8;
    pvVar21 = pvVar14;
    do {
      auVar22 = uv_buf_init(pvVar21,0xd);
      *(long *)((long)pvVar13 + lVar20 + -8) = auVar22._0_8_;
      *(long *)((long)pvVar13 + lVar20) = auVar22._8_8_;
      lVar20 = lVar20 + 0x10;
      pvVar21 = (void *)((long)pvVar21 + 0xd);
    } while (lVar20 != 0xd4318);
    iVar4 = 0;
    iVar5 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    unaff_R12 = 0xd4318;
    if (iVar5 != 0) goto LAB_00161d53;
    if (close_req.result != 0) goto LAB_00161d58;
    uv_fs_req_cleanup();
    iVar4 = 0;
    iVar5 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar5 < 0) goto LAB_00161d5d;
    if (open_req1.result._4_4_ < 0) goto LAB_00161d62;
    uv_fs_req_cleanup();
    iVar4 = 0;
    iVar5 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar13,0xd431,0xffffffffffffffff);
    if (iVar5 < 0) goto LAB_00161d67;
    if (read_req.result != 0x3400) goto LAB_00161d6c;
    unaff_R12 = 0;
    do {
      pcVar15 = (char *)((long)pvVar14 + unaff_R12);
      iVar5 = strncmp(pcVar15,test_buf,0xd);
      iVar4 = (int)pcVar15;
      if (iVar5 != 0) {
        fs_write_alotof_bufs_cold_11();
        goto LAB_00161d35;
      }
      unaff_R12 = unaff_R12 + 0xd;
    } while (unaff_R12 != 0x3400);
    uv_fs_req_cleanup(&read_req);
    free(pvVar14);
    iVar4 = (int)open_req1.result;
    _Var12 = lseek64((int)open_req1.result,write_req.result,0);
    if (_Var12 != write_req.result) goto LAB_00161d71;
    uVar24 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar4 = 0;
    iov = uVar24;
    iVar5 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar5 != 0) goto LAB_00161d76;
    if (read_req.result != 0) goto LAB_00161d7b;
    uv_fs_req_cleanup();
    iVar4 = 0;
    iVar5 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar5 != 0) goto LAB_00161d80;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      free(pvVar13);
      return;
    }
  }
  fs_write_alotof_bufs_cold_16();
  fs_write_alotof_bufs_with_offset(iVar4);
  fs_write_alotof_bufs_with_offset(iVar4);
  pvVar13 = (void *)uv_default_loop();
  uv_walk(pvVar13,close_walk_cb,0);
  uv_run(pvVar13,0);
  uVar7 = uv_default_loop();
  iVar4 = uv_loop_close(uVar7);
  if (iVar4 == 0) {
    uv_library_shutdown();
    return;
  }
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  pcStack_11e8 = (code *)0x161dee;
  uStack_11e0 = extraout_RAX_00;
  pvStack_11d8 = pvVar13;
  lStack_11d0 = unaff_R12;
  unlink("test_file");
  pcStack_11e8 = (code *)0x161df3;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_11e8 = (code *)0x161e04;
  pvVar14 = malloc(0xd4310);
  if (pvVar14 == (void *)0x0) {
LAB_00162149:
    pvVar14 = pvVar13;
    pcStack_11e8 = (code *)0x16214e;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_0016214e:
    pcStack_11e8 = (code *)0x162153;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_00162153:
    pcStack_11e8 = (code *)0x162158;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_00162158:
    pcStack_11e8 = (code *)0x16215d;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_0016215d:
    pcStack_11e8 = (code *)0x162162;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_00162162:
    pcStack_11e8 = (code *)0x162167;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_00162167:
    pcStack_11e8 = (code *)0x16216c;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_0016216c:
    pcStack_11e8 = (code *)0x162171;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_00162171:
    pcStack_11e8 = (code *)0x162176;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_00162176:
    pcStack_11e8 = (code *)0x16217b;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_0016217b:
    pcStack_11e8 = (code *)0x162180;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_00162180:
    pcStack_11e8 = (code *)0x162185;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_00162185:
    pcStack_11e8 = (code *)0x16218a;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_0016218a:
    pcStack_11e8 = (code *)0x16218f;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_0016218f:
    pcStack_11e8 = (code *)0x162194;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    pcStack_11e8 = (code *)0x161e33;
    iVar4 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar4 < 0) goto LAB_0016214e;
    if (open_req1.result._4_4_ < 0) goto LAB_00162153;
    pcStack_11e8 = (code *)0x161e55;
    uv_fs_req_cleanup(&open_req1);
    pcStack_11e8 = (code *)0x161e66;
    uVar24 = (uv_buf_t)uv_buf_init("0123456789",10);
    uStack_11e0 = 0;
    pcStack_11e8 = (code *)0x161ea4;
    iov = uVar24;
    iVar4 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar4 != 10) goto LAB_00162158;
    if (write_req.result != 10) goto LAB_0016215d;
    pcStack_11e8 = (code *)0x161ec7;
    uv_fs_req_cleanup(&write_req);
    lVar20 = 8;
    do {
      pcStack_11e8 = (code *)0x161ee1;
      auVar22 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar14 + lVar20 + -8) = auVar22._0_8_;
      *(long *)((long)pvVar14 + lVar20) = auVar22._8_8_;
      lVar20 = lVar20 + 0x10;
    } while (lVar20 != 0xd4318);
    uStack_11e0 = 0;
    pcStack_11e8 = (code *)0x161f22;
    iVar4 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar14,0xd431,10);
    if (iVar4 < 0) goto LAB_00162162;
    if (write_req.result != 0xac67d) goto LAB_00162167;
    pcStack_11e8 = (code *)0x161f47;
    uv_fs_req_cleanup(&write_req);
    pcStack_11e8 = (code *)0x161f51;
    pcVar15 = (char *)malloc(0xac67d);
    if (pcVar15 == (char *)0x0) goto LAB_0016216c;
    lVar20 = 8;
    pcVar17 = pcVar15;
    do {
      pcStack_11e8 = (code *)0x161f73;
      auVar22 = uv_buf_init(pcVar17,0xd);
      *(long *)((long)pvVar14 + lVar20 + -8) = auVar22._0_8_;
      *(long *)((long)pvVar14 + lVar20) = auVar22._8_8_;
      lVar20 = lVar20 + 0x10;
      pcVar17 = pcVar17 + 0xd;
    } while (lVar20 != 0xd4318);
    uStack_11e0 = 0;
    pcStack_11e8 = (code *)0x161fb8;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar14,0xd431,10);
    if (iVar4 < 0) goto LAB_00162171;
    lVar20 = 0xd;
    if (iVar4 != 0xd) {
      lVar20 = 0x3400;
    }
    if (read_req.result != lVar20) goto LAB_00162176;
    pcVar17 = pcVar15;
    uVar6 = 0;
    do {
      pcStack_11e8 = (code *)0x161ffd;
      iVar5 = strncmp(pcVar17,test_buf,0xd);
      if (iVar5 != 0) {
        pcStack_11e8 = (code *)0x162149;
        fs_write_alotof_bufs_with_offset_cold_9();
        pvVar13 = pvVar14;
        goto LAB_00162149;
      }
      if (iVar4 == 0xd) break;
      pcVar17 = pcVar17 + 0xd;
      bVar2 = uVar6 < 0x3ff;
      uVar6 = uVar6 + 1;
    } while (bVar2);
    pcStack_11e8 = (code *)0x16202a;
    uv_fs_req_cleanup(&read_req);
    pcStack_11e8 = (code *)0x162032;
    free(pcVar15);
    pcStack_11e8 = (code *)0x162049;
    iVar4 = uv_fs_stat(0,&stat_req,"test_file",0);
    if (iVar4 != 0) goto LAB_0016217b;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + 10) goto LAB_00162180;
    pcStack_11e8 = (code *)0x162079;
    uv_fs_req_cleanup(&stat_req);
    pcStack_11e8 = (code *)0x16208a;
    uVar24 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_11e0 = 0;
    pcStack_11e8 = (code *)0x1620cc;
    iov = uVar24;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,write_req.result + 10);
    if (iVar4 != 0) goto LAB_00162185;
    if (read_req.result != 0) goto LAB_0016218a;
    pcStack_11e8 = (code *)0x1620ee;
    uv_fs_req_cleanup(&read_req);
    pcStack_11e8 = (code *)0x162104;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar4 != 0) goto LAB_0016218f;
    if (close_req.result == 0) {
      pcStack_11e8 = (code *)0x162122;
      uv_fs_req_cleanup(&close_req);
      pcStack_11e8 = (code *)0x16212e;
      unlink("test_file");
      free(pvVar14);
      return;
    }
  }
  pcStack_11e8 = run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  pcStack_11e8 = (code *)pvVar14;
  loop = (uv_loop_t *)uv_default_loop();
  rmdir("test_dir");
  iVar4 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar4 == 0) {
    uv_run(loop,0);
    if (mkdir_cb_count != 1) goto LAB_00162310;
    iVar4 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,0);
    if (iVar4 < 0) goto LAB_00162315;
    uv_fs_req_cleanup(&open_req1);
    uVar24 = (uv_buf_t)uv_buf_init(auStack_11ea,2);
    iov = uVar24;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0,0);
    if (iVar4 != -0x15) goto LAB_0016231a;
    uv_fs_req_cleanup(&read_req);
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar4 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      uVar7 = uv_default_loop();
      uv_walk(uVar7,close_walk_cb,0);
      uv_run(uVar7,0);
      uVar7 = uv_default_loop();
      iVar4 = uv_loop_close(uVar7);
      if (iVar4 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_00162324;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_00162310:
    run_test_fs_read_dir_cold_2();
LAB_00162315:
    run_test_fs_read_dir_cold_3();
LAB_0016231a:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_00162324:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return;
}

Assistant:

static void utime_cb(uv_fs_t* req) {
  utime_check_t* c;

  ASSERT(req == &utime_req);
  ASSERT(req->result == 0);
  ASSERT(req->fs_type == UV_FS_UTIME);

  c = req->data;
  check_utime(c->path, c->atime, c->mtime, /* test_lutime */ 0);

  uv_fs_req_cleanup(req);
  utime_cb_count++;
}